

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall cmTarget::AppendProperty(cmTarget *this,string *prop,char *value,bool asString)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  cmMakefile *pcVar2;
  char *prop_00;
  bool bVar3;
  TargetType tgtType;
  pointer pcVar4;
  cmMessenger *messenger;
  ostream *poVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_748;
  undefined1 local_728 [8];
  cmListFileBacktrace lfbt_7;
  cmListFileBacktrace lfbt_6;
  cmListFileBacktrace lfbt_5;
  cmListFileBacktrace lfbt_4;
  cmListFileBacktrace lfbt_3;
  cmListFileBacktrace lfbt_2;
  cmListFileBacktrace lfbt_1;
  cmListFileBacktrace lfbt;
  ostringstream local_688 [8];
  ostringstream e_3;
  string local_510;
  ostringstream local_4f0 [8];
  ostringstream e_2;
  string local_378;
  ostringstream local_358 [8];
  ostringstream e_1;
  string local_1e0;
  ostringstream local_1c0 [8];
  ostringstream e;
  undefined1 local_38 [31];
  bool asString_local;
  char *value_local;
  string *prop_local;
  cmTarget *this_local;
  
  local_38[0x17] = asString;
  unique0x1000105e = (_Elt_pointer)value;
  value_local = (char *)prop;
  prop_local = (string *)this;
  tgtType = GetType(this);
  prop_00 = value_local;
  pcVar4 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                     (&this->impl);
  messenger = cmMakefile::GetMessenger(pcVar4->Makefile);
  std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
            (&this->impl);
  cmMakefile::GetBacktrace((cmMakefile *)local_38);
  bVar3 = cmTargetPropertyComputer::PassesWhitelist
                    (tgtType,(string *)prop_00,messenger,(cmListFileBacktrace *)local_38);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_38);
  if (((bVar3 ^ 0xffU) & 1) == 0) {
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            value_local,"NAME");
    if (bVar3) {
      std::__cxx11::ostringstream::ostringstream(local_1c0);
      std::operator<<((ostream *)local_1c0,"NAME property is read-only\n");
      pcVar4 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
               operator->(&this->impl);
      pcVar2 = pcVar4->Makefile;
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_1e0);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::__cxx11::ostringstream::~ostringstream(local_1c0);
    }
    else {
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              value_local,"EXPORT_NAME");
      if ((bVar3) && (bVar3 = IsImported(this), bVar3)) {
        std::__cxx11::ostringstream::ostringstream(local_358);
        poVar5 = std::operator<<((ostream *)local_358,
                                 "EXPORT_NAME property can\'t be set on imported targets (\"");
        pcVar4 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                 operator->(&this->impl);
        poVar5 = std::operator<<(poVar5,(string *)&pcVar4->Name);
        std::operator<<(poVar5,"\")\n");
        pcVar4 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                 operator->(&this->impl);
        pcVar2 = pcVar4->Makefile;
        std::__cxx11::ostringstream::str();
        cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_378);
        std::__cxx11::string::~string((string *)&local_378);
        std::__cxx11::ostringstream::~ostringstream(local_358);
      }
      else {
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )value_local,"SOURCES");
        if ((bVar3) && (bVar3 = IsImported(this), bVar3)) {
          std::__cxx11::ostringstream::ostringstream(local_4f0);
          poVar5 = std::operator<<((ostream *)local_4f0,
                                   "SOURCES property can\'t be set on imported targets (\"");
          pcVar4 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                   operator->(&this->impl);
          poVar5 = std::operator<<(poVar5,(string *)&pcVar4->Name);
          std::operator<<(poVar5,"\")\n");
          pcVar4 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                   operator->(&this->impl);
          pcVar2 = pcVar4->Makefile;
          std::__cxx11::ostringstream::str();
          cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_510);
          std::__cxx11::string::~string((string *)&local_510);
          std::__cxx11::ostringstream::~ostringstream(local_4f0);
        }
        else {
          bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)value_local,"IMPORTED_GLOBAL");
          if (bVar3) {
            std::__cxx11::ostringstream::ostringstream(local_688);
            poVar5 = std::operator<<((ostream *)local_688,
                                     "IMPORTED_GLOBAL property can\'t be appended, only set on imported targets (\""
                                    );
            pcVar4 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                     operator->(&this->impl);
            poVar5 = std::operator<<(poVar5,(string *)&pcVar4->Name);
            std::operator<<(poVar5,"\")\n");
            pcVar4 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                     operator->(&this->impl);
            pcVar2 = pcVar4->Makefile;
            std::__cxx11::ostringstream::str();
            cmMakefile::IssueMessage
                      (pcVar2,FATAL_ERROR,
                       (string *)
                       &lfbt.TopEntry.
                        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
            std::__cxx11::string::~string
                      ((string *)
                       &lfbt.TopEntry.
                        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
            std::__cxx11::ostringstream::~ostringstream(local_688);
          }
          else {
            bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)value_local,"INCLUDE_DIRECTORIES");
            if (bVar3) {
              if ((stack0xffffffffffffffe0 != (_Elt_pointer)0x0) &&
                 (*(char *)&(stack0xffffffffffffffe0->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start != '\0')) {
                pcVar4 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                         ::operator->(&this->impl);
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<char_const*&>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &pcVar4->IncludeDirectoriesEntries,(char **)(local_38 + 0x18));
                std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                operator->(&this->impl);
                p_Var1 = &lfbt_1.TopEntry.
                          super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount;
                cmMakefile::GetBacktrace((cmMakefile *)p_Var1);
                pcVar4 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                         ::operator->(&this->impl);
                std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
                          (&pcVar4->IncludeDirectoriesBacktraces,(value_type *)p_Var1);
                cmListFileBacktrace::~cmListFileBacktrace
                          ((cmListFileBacktrace *)
                           &lfbt_1.TopEntry.
                            super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
              }
            }
            else {
              bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)value_local,"COMPILE_OPTIONS");
              if (bVar3) {
                if ((stack0xffffffffffffffe0 != (_Elt_pointer)0x0) &&
                   (*(char *)&(stack0xffffffffffffffe0->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start != '\0')) {
                  pcVar4 = std::
                           unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                           operator->(&this->impl);
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<char_const*&>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &pcVar4->CompileOptionsEntries,(char **)(local_38 + 0x18));
                  std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                  operator->(&this->impl);
                  p_Var1 = &lfbt_2.TopEntry.
                            super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount;
                  cmMakefile::GetBacktrace((cmMakefile *)p_Var1);
                  pcVar4 = std::
                           unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                           operator->(&this->impl);
                  std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::push_back
                            (&pcVar4->CompileOptionsBacktraces,(value_type *)p_Var1);
                  cmListFileBacktrace::~cmListFileBacktrace
                            ((cmListFileBacktrace *)
                             &lfbt_2.TopEntry.
                              super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
                }
              }
              else {
                bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)value_local,"COMPILE_FEATURES");
                if (bVar3) {
                  if ((stack0xffffffffffffffe0 != (_Elt_pointer)0x0) &&
                     (*(char *)&(stack0xffffffffffffffe0->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start != '\0')) {
                    pcVar4 = std::
                             unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                             ::operator->(&this->impl);
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<char_const*&>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &pcVar4->CompileFeaturesEntries,(char **)(local_38 + 0x18));
                    std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                    operator->(&this->impl);
                    p_Var1 = &lfbt_3.TopEntry.
                              super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount;
                    cmMakefile::GetBacktrace((cmMakefile *)p_Var1);
                    pcVar4 = std::
                             unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                             ::operator->(&this->impl);
                    std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                    push_back(&pcVar4->CompileFeaturesBacktraces,(value_type *)p_Var1);
                    cmListFileBacktrace::~cmListFileBacktrace
                              ((cmListFileBacktrace *)
                               &lfbt_3.TopEntry.
                                super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount);
                  }
                }
                else {
                  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)value_local,"COMPILE_DEFINITIONS");
                  if (bVar3) {
                    if ((stack0xffffffffffffffe0 != (_Elt_pointer)0x0) &&
                       (*(char *)&(stack0xffffffffffffffe0->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start != '\0')) {
                      pcVar4 = std::
                               unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                               ::operator->(&this->impl);
                      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                      emplace_back<char_const*&>
                                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                  *)&pcVar4->CompileDefinitionsEntries,(char **)(local_38 + 0x18));
                      std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                      operator->(&this->impl);
                      p_Var1 = &lfbt_4.TopEntry.
                                super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount;
                      cmMakefile::GetBacktrace((cmMakefile *)p_Var1);
                      pcVar4 = std::
                               unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                               ::operator->(&this->impl);
                      std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                      push_back(&pcVar4->CompileDefinitionsBacktraces,(value_type *)p_Var1);
                      cmListFileBacktrace::~cmListFileBacktrace
                                ((cmListFileBacktrace *)
                                 &lfbt_4.TopEntry.
                                  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
                    }
                  }
                  else {
                    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)value_local,"LINK_OPTIONS");
                    if (bVar3) {
                      if ((stack0xffffffffffffffe0 != (_Elt_pointer)0x0) &&
                         (*(char *)&(stack0xffffffffffffffe0->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start != '\0')) {
                        pcVar4 = std::
                                 unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                 ::operator->(&this->impl);
                        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                        emplace_back<char_const*&>
                                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                    *)&pcVar4->LinkOptionsEntries,(char **)(local_38 + 0x18));
                        std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                        ::operator->(&this->impl);
                        p_Var1 = &lfbt_5.TopEntry.
                                  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount;
                        cmMakefile::GetBacktrace((cmMakefile *)p_Var1);
                        pcVar4 = std::
                                 unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                 ::operator->(&this->impl);
                        std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                        push_back(&pcVar4->LinkOptionsBacktraces,(value_type *)p_Var1);
                        cmListFileBacktrace::~cmListFileBacktrace
                                  ((cmListFileBacktrace *)
                                   &lfbt_5.TopEntry.
                                    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount);
                      }
                    }
                    else {
                      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)value_local,"LINK_DIRECTORIES");
                      if (bVar3) {
                        if ((stack0xffffffffffffffe0 != (_Elt_pointer)0x0) &&
                           (*(char *)&(stack0xffffffffffffffe0->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start != '\0')) {
                          pcVar4 = std::
                                   unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                   ::operator->(&this->impl);
                          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                          emplace_back<char_const*&>
                                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                      *)&pcVar4->LinkDirectoriesEntries,(char **)(local_38 + 0x18));
                          std::
                          unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                          operator->(&this->impl);
                          p_Var1 = &lfbt_6.TopEntry.
                                    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount;
                          cmMakefile::GetBacktrace((cmMakefile *)p_Var1);
                          pcVar4 = std::
                                   unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                   ::operator->(&this->impl);
                          std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                          push_back(&pcVar4->LinkDirectoriesBacktraces,(value_type *)p_Var1);
                          cmListFileBacktrace::~cmListFileBacktrace
                                    ((cmListFileBacktrace *)
                                     &lfbt_6.TopEntry.
                                      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount);
                        }
                      }
                      else {
                        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)value_local,"LINK_LIBRARIES");
                        if (bVar3) {
                          if ((stack0xffffffffffffffe0 != (_Elt_pointer)0x0) &&
                             (*(char *)&(stack0xffffffffffffffe0->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start != '\0')) {
                            std::
                            unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                            operator->(&this->impl);
                            cmMakefile::GetBacktrace
                                      ((cmMakefile *)
                                       &lfbt_7.TopEntry.
                                        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount);
                            pcVar4 = std::
                                     unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                     ::operator->(&this->impl);
                            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                            emplace_back<char_const*&>
                                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                        *)&pcVar4->LinkImplementationPropertyEntries,
                                       (char **)(local_38 + 0x18));
                            pcVar4 = std::
                                     unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                     ::operator->(&this->impl);
                            std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                            push_back(&pcVar4->LinkImplementationPropertyBacktraces,
                                      (value_type *)
                                      &lfbt_7.TopEntry.
                                       super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount);
                            cmListFileBacktrace::~cmListFileBacktrace
                                      ((cmListFileBacktrace *)
                                       &lfbt_7.TopEntry.
                                        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount);
                          }
                        }
                        else {
                          bVar3 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)value_local,"SOURCES");
                          if (bVar3) {
                            std::
                            unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                            operator->(&this->impl);
                            cmMakefile::GetBacktrace((cmMakefile *)local_728);
                            pcVar4 = std::
                                     unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                     ::operator->(&this->impl);
                            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                            emplace_back<char_const*&>
                                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                        *)&pcVar4->SourceEntries,(char **)(local_38 + 0x18));
                            pcVar4 = std::
                                     unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                     ::operator->(&this->impl);
                            std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
                            push_back(&pcVar4->SourceBacktraces,(value_type *)local_728);
                            cmListFileBacktrace::~cmListFileBacktrace
                                      ((cmListFileBacktrace *)local_728);
                          }
                          else {
                            bVar3 = cmHasLiteralPrefix<std::__cxx11::string,17ul>
                                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)value_local,(char (*) [17])"IMPORTED_LIBNAME");
                            if (bVar3) {
                              pcVar4 = std::
                                       unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                       ::operator->(&this->impl);
                              pcVar2 = pcVar4->Makefile;
                              std::operator+(&local_748,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)value_local," property may not be APPENDed.");
                              cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_748);
                              std::__cxx11::string::~string((string *)&local_748);
                            }
                            else {
                              pcVar4 = std::
                                       unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                       ::operator->(&this->impl);
                              cmPropertyMap::AppendProperty
                                        (&pcVar4->Properties,(string *)value_local,
                                         (char *)stack0xffffffffffffffe0,(bool)(local_38[0x17] & 1))
                              ;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void cmTarget::AppendProperty(const std::string& prop, const char* value,
                              bool asString)
{
  if (!cmTargetPropertyComputer::PassesWhitelist(
        this->GetType(), prop, impl->Makefile->GetMessenger(),
        impl->Makefile->GetBacktrace())) {
    return;
  }
  if (prop == "NAME") {
    std::ostringstream e;
    e << "NAME property is read-only\n";
    impl->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }
  if (prop == "EXPORT_NAME" && this->IsImported()) {
    std::ostringstream e;
    e << "EXPORT_NAME property can't be set on imported targets (\""
      << impl->Name << "\")\n";
    impl->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }
  if (prop == "SOURCES" && this->IsImported()) {
    std::ostringstream e;
    e << "SOURCES property can't be set on imported targets (\"" << impl->Name
      << "\")\n";
    impl->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }
  if (prop == "IMPORTED_GLOBAL") {
    std::ostringstream e;
    e << "IMPORTED_GLOBAL property can't be appended, only set on imported "
         "targets (\""
      << impl->Name << "\")\n";
    impl->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }
  if (prop == "INCLUDE_DIRECTORIES") {
    if (value && *value) {
      impl->IncludeDirectoriesEntries.emplace_back(value);
      cmListFileBacktrace lfbt = impl->Makefile->GetBacktrace();
      impl->IncludeDirectoriesBacktraces.push_back(lfbt);
    }
  } else if (prop == "COMPILE_OPTIONS") {
    if (value && *value) {
      impl->CompileOptionsEntries.emplace_back(value);
      cmListFileBacktrace lfbt = impl->Makefile->GetBacktrace();
      impl->CompileOptionsBacktraces.push_back(lfbt);
    }
  } else if (prop == "COMPILE_FEATURES") {
    if (value && *value) {
      impl->CompileFeaturesEntries.emplace_back(value);
      cmListFileBacktrace lfbt = impl->Makefile->GetBacktrace();
      impl->CompileFeaturesBacktraces.push_back(lfbt);
    }
  } else if (prop == "COMPILE_DEFINITIONS") {
    if (value && *value) {
      impl->CompileDefinitionsEntries.emplace_back(value);
      cmListFileBacktrace lfbt = impl->Makefile->GetBacktrace();
      impl->CompileDefinitionsBacktraces.push_back(lfbt);
    }
  } else if (prop == "LINK_OPTIONS") {
    if (value && *value) {
      impl->LinkOptionsEntries.emplace_back(value);
      cmListFileBacktrace lfbt = impl->Makefile->GetBacktrace();
      impl->LinkOptionsBacktraces.push_back(lfbt);
    }
  } else if (prop == "LINK_DIRECTORIES") {
    if (value && *value) {
      impl->LinkDirectoriesEntries.emplace_back(value);
      cmListFileBacktrace lfbt = impl->Makefile->GetBacktrace();
      impl->LinkDirectoriesBacktraces.push_back(lfbt);
    }
  } else if (prop == "LINK_LIBRARIES") {
    if (value && *value) {
      cmListFileBacktrace lfbt = impl->Makefile->GetBacktrace();
      impl->LinkImplementationPropertyEntries.emplace_back(value);
      impl->LinkImplementationPropertyBacktraces.push_back(lfbt);
    }
  } else if (prop == "SOURCES") {
    cmListFileBacktrace lfbt = impl->Makefile->GetBacktrace();
    impl->SourceEntries.emplace_back(value);
    impl->SourceBacktraces.push_back(lfbt);
  } else if (cmHasLiteralPrefix(prop, "IMPORTED_LIBNAME")) {
    impl->Makefile->IssueMessage(MessageType::FATAL_ERROR,
                                 prop + " property may not be APPENDed.");
  } else {
    impl->Properties.AppendProperty(prop, value, asString);
  }
}